

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O0

int roslz4_buffToBuffCompress
              (char *input,uint input_size,char *output,uint *output_size,int block_size_id)

{
  int *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  int ret;
  roslz4_stream stream;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar1;
  undefined4 in_stack_ffffffffffffffbc;
  int local_4;
  
  iVar1 = *in_RCX;
  local_4 = roslz4_compressStart
                      ((roslz4_stream *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  if (local_4 == 0) {
    local_4 = 0;
    do {
      if (in_ESI < 1 || local_4 == 2) {
        *in_RCX = *in_RCX - iVar1;
        roslz4_compressEnd((roslz4_stream *)0x1867cb);
        if ((in_ESI == 0) && (local_4 == 2)) {
          return 0;
        }
        return -1;
      }
      local_4 = roslz4_compress((roslz4_stream *)CONCAT44(in_stack_ffffffffffffffbc,iVar1),
                                (int)((ulong)in_RDX >> 0x20));
    } while ((local_4 != -1) && (local_4 != -2));
    roslz4_compressEnd((roslz4_stream *)0x1867a3);
  }
  else {
    roslz4_compressEnd((roslz4_stream *)0x186746);
  }
  return local_4;
}

Assistant:

int roslz4_buffToBuffCompress(char *input, unsigned int input_size,
                              char *output, unsigned int *output_size,
                              int block_size_id) {
  roslz4_stream stream;
  stream.input_next = input;
  stream.input_left = input_size;
  stream.output_next = output;
  stream.output_left = *output_size;

  int ret;
  ret = roslz4_compressStart(&stream, block_size_id);
  if (ret != ROSLZ4_OK) {
    roslz4_compressEnd(&stream);
    return ret;
  }

  while (stream.input_left > 0 && ret != ROSLZ4_STREAM_END) {
    ret = roslz4_compress(&stream, ROSLZ4_FINISH);
    if (ret == ROSLZ4_ERROR || ret == ROSLZ4_OUTPUT_SMALL) {
      roslz4_compressEnd(&stream);
      return ret;
    }
  }

  *output_size = *output_size - stream.output_left;
  roslz4_compressEnd(&stream);

  if (stream.input_left == 0 && ret == ROSLZ4_STREAM_END) {
    return ROSLZ4_OK; // Success
  } else {
    return ROSLZ4_ERROR; // User did not provide exact buffer
  }
}